

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_sse4.h
# Opt level: O0

__m128i blend_8_b12(uint16_t *src0,uint16_t *src1,__m128i v_m0_w,__m128i v_m1_w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *in_RSI;
  void *pvVar5;
  void *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  __m128i alVar8;
  __m128i v_val_w;
  __m128i v_res_w;
  __m128i v_pssum_d;
  __m128i v_ssumh_d;
  __m128i v_ssuml_d;
  __m128i v_sumh_d;
  __m128i v_suml_d;
  __m128i v_s01h_w;
  __m128i v_s01l_w;
  __m128i v_m01h_w;
  __m128i v_m01l_w;
  __m128i v_s1_w;
  __m128i v_s0_w;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 local_f8;
  undefined2 uStack_f6;
  undefined2 uStack_f4;
  undefined2 uStack_f2;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pvVar5 = in_RSI;
  xx_loadu_128(in_RDI);
  xx_loadu_128(in_RSI);
  local_f8 = (undefined2)in_XMM0_Qa;
  uStack_f6 = (undefined2)((ulong)in_XMM0_Qa >> 0x10);
  uStack_f4 = (undefined2)((ulong)in_XMM0_Qa >> 0x20);
  uStack_f2 = (undefined2)((ulong)in_XMM0_Qa >> 0x30);
  local_108 = (undefined2)in_XMM1_Qa;
  uStack_106 = (undefined2)((ulong)in_XMM1_Qa >> 0x10);
  uStack_104 = (undefined2)((ulong)in_XMM1_Qa >> 0x20);
  uStack_102 = (undefined2)((ulong)in_XMM1_Qa >> 0x30);
  uStack_b0 = (undefined2)in_XMM0_Qb;
  uStack_ae = (undefined2)((ulong)in_XMM0_Qb >> 0x10);
  uStack_ac = (undefined2)((ulong)in_XMM0_Qb >> 0x20);
  uStack_aa = (undefined2)((ulong)in_XMM0_Qb >> 0x30);
  uStack_c0 = (undefined2)in_XMM1_Qb;
  uStack_be = (undefined2)((ulong)in_XMM1_Qb >> 0x10);
  uStack_bc = (undefined2)((ulong)in_XMM1_Qb >> 0x20);
  uStack_ba = (undefined2)((ulong)in_XMM1_Qb >> 0x30);
  local_118 = (undefined2)extraout_XMM0_Qa;
  uStack_116 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x10);
  uStack_114 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x20);
  uStack_112 = (undefined2)((ulong)extraout_XMM0_Qa >> 0x30);
  local_128 = (undefined2)extraout_XMM0_Qa_00;
  uStack_126 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x10);
  uStack_124 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  uStack_122 = (undefined2)((ulong)extraout_XMM0_Qa_00 >> 0x30);
  uStack_d0 = (undefined2)extraout_XMM0_Qb;
  uStack_ce = (undefined2)((ulong)extraout_XMM0_Qb >> 0x10);
  uStack_cc = (undefined2)((ulong)extraout_XMM0_Qb >> 0x20);
  uStack_ca = (undefined2)((ulong)extraout_XMM0_Qb >> 0x30);
  uStack_e0 = (undefined2)extraout_XMM0_Qb_00;
  uStack_de = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x10);
  uStack_dc = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  uStack_da = (undefined2)((ulong)extraout_XMM0_Qb_00 >> 0x30);
  auVar2._2_2_ = local_128;
  auVar2._0_2_ = local_118;
  auVar2._4_2_ = uStack_116;
  auVar2._6_2_ = uStack_126;
  auVar2._10_2_ = uStack_124;
  auVar2._8_2_ = uStack_114;
  auVar2._12_2_ = uStack_112;
  auVar2._14_2_ = uStack_122;
  auVar6._2_2_ = local_108;
  auVar6._0_2_ = local_f8;
  auVar6._4_2_ = uStack_f6;
  auVar6._6_2_ = uStack_106;
  auVar6._10_2_ = uStack_104;
  auVar6._8_2_ = uStack_f4;
  auVar6._12_2_ = uStack_f2;
  auVar6._14_2_ = uStack_102;
  auVar6 = pmaddwd(auVar2,auVar6);
  auVar1._2_2_ = uStack_e0;
  auVar1._0_2_ = uStack_d0;
  auVar1._4_2_ = uStack_ce;
  auVar1._6_2_ = uStack_de;
  auVar1._10_2_ = uStack_dc;
  auVar1._8_2_ = uStack_cc;
  auVar1._12_2_ = uStack_ca;
  auVar1._14_2_ = uStack_da;
  auVar7._2_2_ = uStack_c0;
  auVar7._0_2_ = uStack_b0;
  auVar7._4_2_ = uStack_ae;
  auVar7._6_2_ = uStack_be;
  auVar7._10_2_ = uStack_bc;
  auVar7._8_2_ = uStack_ac;
  auVar7._12_2_ = uStack_aa;
  auVar7._14_2_ = uStack_ba;
  auVar7 = pmaddwd(auVar1,auVar7);
  local_38 = auVar6._0_4_;
  uStack_34 = auVar6._4_4_;
  uStack_30 = auVar6._8_4_;
  uStack_2c = auVar6._12_4_;
  local_58 = auVar7._0_4_;
  uStack_54 = auVar7._4_4_;
  uStack_50 = auVar7._8_4_;
  uStack_4c = auVar7._12_4_;
  auVar4._4_4_ = uStack_34 >> 5;
  auVar4._0_4_ = local_38 >> 5;
  auVar4._12_4_ = uStack_2c >> 5;
  auVar4._8_4_ = uStack_30 >> 5;
  auVar3._4_4_ = uStack_54 >> 5;
  auVar3._0_4_ = local_58 >> 5;
  auVar3._12_4_ = uStack_4c >> 5;
  auVar3._8_4_ = uStack_50 >> 5;
  packssdw(auVar4,auVar3);
  v_val_w[1] = (longlong)pvVar5;
  v_val_w[0] = (longlong)in_RSI;
  alVar8 = xx_round_epu16(v_val_w);
  alVar8[0] = alVar8[0];
  alVar8[1] = alVar8[1];
  return alVar8;
}

Assistant:

static inline __m128i blend_8_b12(const uint16_t *src0, const uint16_t *src1,
                                  const __m128i v_m0_w, const __m128i v_m1_w) {
  const __m128i v_s0_w = xx_loadu_128(src0);
  const __m128i v_s1_w = xx_loadu_128(src1);

  // Interleave
  const __m128i v_m01l_w = _mm_unpacklo_epi16(v_m0_w, v_m1_w);
  const __m128i v_m01h_w = _mm_unpackhi_epi16(v_m0_w, v_m1_w);
  const __m128i v_s01l_w = _mm_unpacklo_epi16(v_s0_w, v_s1_w);
  const __m128i v_s01h_w = _mm_unpackhi_epi16(v_s0_w, v_s1_w);

  // Multiply-Add
  const __m128i v_suml_d = _mm_madd_epi16(v_s01l_w, v_m01l_w);
  const __m128i v_sumh_d = _mm_madd_epi16(v_s01h_w, v_m01h_w);

  // Scale
  const __m128i v_ssuml_d =
      _mm_srli_epi32(v_suml_d, AOM_BLEND_A64_ROUND_BITS - 1);
  const __m128i v_ssumh_d =
      _mm_srli_epi32(v_sumh_d, AOM_BLEND_A64_ROUND_BITS - 1);

  // Pack
  const __m128i v_pssum_d = _mm_packs_epi32(v_ssuml_d, v_ssumh_d);

  // Round
  const __m128i v_res_w = xx_round_epu16(v_pssum_d);

  return v_res_w;
}